

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall ON_MappingChannel::Read(ON_MappingChannel *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ON_Xform *pOVar4;
  ON_Xform *pOVar5;
  ON_Xform *x;
  bool bVar6;
  byte bVar7;
  int minor_version;
  int major_version;
  int local_28 [2];
  
  bVar7 = 0;
  memset(this,0,0x98);
  this->m_mapping_index = -1;
  this->m_mapping_channel_id = 1;
  x = &this->m_object_xform;
  pOVar4 = &ON_Xform::IdentityTransformation;
  pOVar5 = x;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pOVar5->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pOVar5 = (ON_Xform *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
  }
  local_28[0] = 0;
  local_28[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_28 + 1,local_28);
  if (bVar1) {
    bVar6 = local_28[1] == 1;
    if (bVar6) {
      bVar6 = ON_BinaryArchive::ReadInt(archive,&this->m_mapping_channel_id);
    }
    if (bVar6 != false) {
      bVar6 = ON_BinaryArchive::ReadUuid(archive,&this->m_mapping_id);
    }
    if ((bVar6 != false) && (0 < local_28[0])) {
      bVar6 = ON_BinaryArchive::ReadXform(archive,x);
      if (bVar6) {
        uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive);
        if (uVar2 < 0xbf510ee) {
          bVar1 = ON_Xform::IsZero(x);
          if (bVar1) {
            pOVar4 = &ON_Xform::IdentityTransformation;
            for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
              x->m_xform[0][0] = pOVar4->m_xform[0][0];
              pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
              x = (ON_Xform *)((long)x + (ulong)bVar7 * -0x10 + 8);
            }
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar6);
  }
  return bVar1;
}

Assistant:

bool ON_MappingChannel::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (rc)
  {
    rc = (1 == major_version);
    if (rc) rc = archive.ReadInt(&m_mapping_channel_id);
    if (rc) rc = archive.ReadUuid(m_mapping_id);

    if ( rc && minor_version >= 1 )
    {
      // 1.1 field added 6 June 2006
      if (rc) rc = archive.ReadXform(m_object_xform);
      if (rc
          && archive.ArchiveOpenNURBSVersion() < 200610030
          && m_object_xform.IsZero()
          )
      {
        // Between versions 200606060 and 200610030,
        // there was a bug that created some mapping
        // channels with zero transformations.  This
        // if clause finds those and sets them to the
        // identity.
        m_object_xform = ON_Xform::IdentityTransformation;
      }
    }

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}